

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O0

OperationId __thiscall
de::Random::
chooseWeighted<deqp::egl::OperationId,__gnu_cxx::__normal_iterator<deqp::egl::OperationId*,std::vector<deqp::egl::OperationId,std::allocator<deqp::egl::OperationId>>>,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
          (Random *this,
          __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
          first,__normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
                last,__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> weight)

{
  bool bVar1;
  reference pfVar2;
  reference pOVar3;
  __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
  local_80;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_78;
  float local_6c;
  __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
  _Stack_68;
  float w;
  float local_5c;
  __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
  _Stack_58;
  float curWeight;
  __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
  lastNonZero;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> _Stack_48;
  float p;
  __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
  local_40;
  int local_38;
  float local_34;
  int ndx;
  float weightSum;
  Random *this_local;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> weight_local;
  __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
  last_local;
  __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
  first_local;
  
  local_34 = 0.0;
  local_38 = 0;
  _ndx = this;
  this_local = (Random *)weight._M_current;
  weight_local._M_current = (float *)last._M_current;
  last_local._M_current = first._M_current;
  while( true ) {
    local_40 = __gnu_cxx::
               __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
               ::operator+(&last_local,(long)local_38);
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
                        *)&weight_local);
    if (!bVar1) break;
    _Stack_48 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *
                          )&this_local,(long)local_38);
    pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&stack0xffffffffffffffb8);
    local_34 = *pfVar2 + local_34;
    local_38 = local_38 + 1;
  }
  lastNonZero._M_current._4_4_ = getFloat(this,0.0,local_34);
  _Stack_58._M_current = (OperationId *)weight_local._M_current;
  local_5c = 0.0;
  local_38 = 0;
  while( true ) {
    _Stack_68 = __gnu_cxx::
                __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
                ::operator+(&last_local,(long)local_38);
    bVar1 = __gnu_cxx::operator!=
                      (&stack0xffffffffffffff98,
                       (__normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
                        *)&weight_local);
    if (!bVar1) {
      pOVar3 = __gnu_cxx::
               __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
               ::operator*(&stack0xffffffffffffffa8);
      return *pOVar3;
    }
    local_78 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                         &this_local,(long)local_38);
    pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_78);
    local_6c = *pfVar2;
    local_5c = local_6c + local_5c;
    if (lastNonZero._M_current._4_4_ < local_5c) break;
    if (0.0 < local_6c) {
      _Stack_58 = __gnu_cxx::
                  __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
                  ::operator+(&last_local,(long)local_38);
    }
    local_38 = local_38 + 1;
  }
  local_80 = __gnu_cxx::
             __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
             ::operator+(&last_local,(long)local_38);
  pOVar3 = __gnu_cxx::
           __normal_iterator<deqp::egl::OperationId_*,_std::vector<deqp::egl::OperationId,_std::allocator<deqp::egl::OperationId>_>_>
           ::operator*(&local_80);
  return *pOVar3;
}

Assistant:

T Random::chooseWeighted (InputIter first, InputIter last, WeightIter weight)
{
	// Compute weight sum
	float	weightSum	= 0.0f;
	int		ndx;
	for (ndx = 0; (first + ndx) != last; ndx++)
		weightSum += *(weight + ndx);

	// Random point in 0..weightSum
	float p = getFloat(0.0f, weightSum);

	// Find item in range
	InputIter	lastNonZero	= last;
	float		curWeight	= 0.0f;
	for (ndx = 0; (first + ndx) != last; ndx++)
	{
		float w = *(weight + ndx);

		curWeight += w;

		if (p < curWeight)
			return *(first + ndx);
		else if (w > 0.0f)
			lastNonZero = first + ndx;
	}

	DE_ASSERT(lastNonZero != last);
	return *lastNonZero;
}